

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expansion.c
# Opt level: O2

void bank_3_patch(dw_rom *rom)

{
  vpatch(rom,0xc288,0x19a,0,0x80,0x60,0x80,0x33,0x80,0x40,0x80,0x48,0x80,0x4b,0x80,0x5a,0x80,0x6e,
         0x80,0x74,0x80,0xa0,0,0xf0,0x49,0,4,0x17,0xa9,2,0xa8,0x20,0xe7,0xc2,0x60,0,4,0x17,0xa9,4,
         0xa0,2,0xd0,0x36,0,4,0x17,0xa9,6,0xa0,2,0xd0,0x2d,0,4,0x17,0xa9,8,0xa0,2,0xd0,0x24,0,4,0x17
         ,0xa9,10,0xa0,2);
  return;
}

Assistant:

void bank_3_patch(dw_rom *rom)
{
    vpatch(rom, 0xc288, 410,
        0x00, 0x80, 0x60, 0x80, 0x33, 0x80, 0x40, 0x80, 0x48, 0x80, 0x4b, 0x80,
        0x5a, 0x80, 0x6e, 0x80, 0x74, 0x80, 0xa0, 0x00, 0xf0, 0x49, 0x00, 0x04,
        0x17, 0xa9, 0x02, 0xa8, 0x20, 0xe7, 0xc2, 0x60, 0x00, 0x04, 0x17, 0xa9,
        0x04, 0xa0, 0x02, 0xd0, 0x36, 0x00, 0x04, 0x17, 0xa9, 0x06, 0xa0, 0x02,
        0xd0, 0x2d, 0x00, 0x04, 0x17, 0xa9, 0x08, 0xa0, 0x02, 0xd0, 0x24, 0x00,
        0x04, 0x17, 0xa9, 0x0a, 0xa0, 0x02, 0xd0, 0x1b, 0x00, 0x04, 0x17, 0xa9,
        0x00, 0xa0, 0x02, 0xd0, 0x12, 0x20, 0xcb, 0xc7, 0xf6, 0xa0, 0x02, 0xa9,
        0x0c, 0xd0, 0x08, 0x20, 0xcb, 0xc7, 0xe4, 0xa9, 0x0e, 0xa0, 0x02, 0x48,
        0xb9, 0x88, 0xc2, 0x8d, 0x01, 0x7f, 0xb9, 0x89, 0xc2, 0x8d, 0x02, 0x7f,
        0xad, 0x04, 0x60, 0x8d, 0x04, 0x70, 0xa9, 0x03, 0x20, 0x91, 0xff, 0x68,
        0x6c, 0x01, 0x7f, 0x00, 0x04, 0x17, 0xa0, 0x04, 0xd0, 0xdd, 0x00, 0x04,
        0x17, 0xa0, 0x08, 0x20, 0xe7, 0xc2, 0x4c, 0x6e, 0x80, 0xa0, 0x06, 0x20,
        0xe7, 0xc2, 0x4c, 0x6e, 0x80, 0xa0, 0x0c, 0x20, 0xe7, 0xc2, 0x4c, 0xf0,
        0xc6, 0x20, 0x1b, 0xe0, 0xe0, 0x04, 0xd0, 0x01, 0x60, 0xa0, 0x10, 0xd0,
        0xb6, 0xc9, 0x04, 0xd0, 0x2b, 0xa9, 0x01, 0x20, 0x4b, 0xe0, 0x20, 0xc5,
        0xc7, 0x29, 0xa5, 0xe0, 0xc9, 0x10, 0xd0, 0x0f, 0x20, 0x5b, 0xc5, 0xa5,
        0x95, 0x29, 0x01, 0xd0, 0x03, 0x4c, 0x58, 0xe6, 0x4c, 0x94, 0xe6, 0x20,
        0x5b, 0xc5, 0xa5, 0x95, 0x29, 0x03, 0x18, 0x69, 0x06, 0x4c, 0x94, 0xe6,
        0xc9, 0x05, 0xd0, 0x12, 0xa9, 0x02, 0x20, 0x4b, 0xe0, 0x20, 0xc5, 0xc7,
        0x2a, 0xa5, 0xe0, 0xc9, 0x10, 0xf0, 0xd1, 0x4c, 0x44, 0xe7, 0x4c, 0xfd,
        0xe6, 0xa5, 0xdf, 0x29, 0x01, 0xf0, 0x07, 0x20, 0xcb, 0xc7, 0xa1, 0x4c,
        0xb8, 0xcc, 0x20, 0xcb, 0xc7, 0xa1, 0x60, 0x85, 0x0e, 0x4c, 0x4b, 0xe0,
        0x48, 0xa5, 0x0e, 0xc9, 0x09, 0xd0, 0x0a, 0x20, 0xcb, 0xc7, 0xa0, 0x20,
        0xfa, 0xdf, 0x4c, 0xb8, 0xcc, 0x68, 0x4c, 0x33, 0xd4, 0xcd, 0x00, 0x01,
        0xb0, 0x07, 0xa5, 0xe0, 0xc9, 0x10, 0xf0, 0x01, 0x18, 0x60, 0x9d, 0xe8,
        0x62, 0x9d, 0x2c, 0x66, 0x9d, 0x2c, 0x67, 0x60, 0xad, 0xdf, 0x64, 0xd0,
        0x03, 0x4c, 0xba, 0xa8, 0xa9, 0x05, 0x8d, 0xe2, 0x64, 0xad, 0x30, 0x66,
        0x85, 0x1a, 0xad, 0x31, 0x66, 0x85, 0x1b, 0xa9, 0x00, 0x85, 0x1c, 0x20,
        0x53, 0xa7, 0x4c, 0x64, 0xa7, 0xa6, 0x45, 0xd0, 0x0b, 0xad, 0x2c, 0x66,
        0x0d, 0x2d, 0x66, 0x0d, 0x2e, 0x66, 0xf0, 0x15, 0xae, 0x2c, 0x66, 0xe8,
        0x8e, 0x2c, 0x66, 0xd0, 0x0c, 0xae, 0x2d, 0x66, 0xe8, 0x8e, 0x2d, 0x66,
        0xd0, 0x03, 0xee, 0x2e, 0x66, 0x4c, 0xf4, 0xfd, 0xa2, 0x02, 0xbd, 0x2c,
        0x66, 0x9d, 0x00, 0x6f, 0xca, 0x10, 0xf7, 0x4c, 0xc5, 0xc7, 0x29, 0x7f,
        0x85, 0x3e, 0x20, 0x15, 0xc1, 0xa5, 0x95, 0x29, 0x3f, 0x65, 0x3e, 0x4c,
        0xc7, 0xee
    );
}